

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image.c
# Opt level: O3

int aom_img_add_metadata
              (aom_image_t *img,uint32_t type,uint8_t *data,size_t sz,
              aom_metadata_insert_flags_t insert_flag)

{
  size_t sVar1;
  aom_metadata_array_t *paVar2;
  aom_metadata_t *metadata;
  aom_metadata_t **ppaVar3;
  int iVar4;
  
  iVar4 = -1;
  if (img != (aom_image_t *)0x0) {
    if (img->metadata == (aom_metadata_array_t *)0x0) {
      paVar2 = (aom_metadata_array_t *)calloc(1,0x10);
      if (paVar2 == (aom_metadata_array_t *)0x0) {
        img->metadata = (aom_metadata_array_t *)0x0;
        return -1;
      }
      img->metadata = paVar2;
    }
    if ((((insert_flag & AOM_MIF_NON_KEY_FRAME_LAYER_SPECIFIC) == AOM_MIF_NON_KEY_FRAME) ||
        ((type != 3 && (type != 5)))) &&
       (metadata = aom_img_metadata_alloc(type,data,sz,insert_flag),
       metadata != (aom_metadata_t *)0x0)) {
      ppaVar3 = (aom_metadata_t **)realloc(img->metadata->metadata_array,img->metadata->sz * 8 + 8);
      if (ppaVar3 == (aom_metadata_t **)0x0) {
        aom_img_metadata_free(metadata);
      }
      else {
        paVar2 = img->metadata;
        paVar2->metadata_array = ppaVar3;
        sVar1 = paVar2->sz;
        ppaVar3[sVar1] = metadata;
        paVar2->sz = sVar1 + 1;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int aom_img_add_metadata(aom_image_t *img, uint32_t type, const uint8_t *data,
                         size_t sz, aom_metadata_insert_flags_t insert_flag) {
  if (!img) return -1;
  if (!img->metadata) {
    img->metadata = aom_img_metadata_array_alloc(0);
    if (!img->metadata) return -1;
  }
  // Some metadata types are not allowed to be layer specific, according to
  // the Table in Section 6.7.1 of the AV1 specifiction.
  // Do not check for OBU_METADATA_TYPE_HDR_CLL or OBU_METADATA_TYPE_HDR_MDCV
  // because there are plans to alow them to be layer specific.
  if ((insert_flag & AOM_MIF_LAYER_SPECIFIC) &&
      (type == OBU_METADATA_TYPE_SCALABILITY ||
       type == OBU_METADATA_TYPE_TIMECODE)) {
    return -1;
  }
  aom_metadata_t *metadata =
      aom_img_metadata_alloc(type, data, sz, insert_flag);
  if (!metadata) return -1;
  aom_metadata_t **metadata_array =
      (aom_metadata_t **)realloc(img->metadata->metadata_array,
                                 (img->metadata->sz + 1) * sizeof(metadata));
  if (!metadata_array) {
    aom_img_metadata_free(metadata);
    return -1;
  }
  img->metadata->metadata_array = metadata_array;
  img->metadata->metadata_array[img->metadata->sz] = metadata;
  img->metadata->sz++;
  return 0;
}